

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbiw__zlib_bitrev(int code,int codebits)

{
  int res;
  int iVar1;
  bool bVar2;
  
  iVar1 = 0;
  while (bVar2 = codebits != 0, codebits = codebits + -1, bVar2) {
    iVar1 = (code & 1U) + iVar1 * 2;
    code = code >> 1;
  }
  return iVar1;
}

Assistant:

static int stbiw__zlib_bitrev(int code, int codebits)
{
   int res=0;
   while (codebits--) {
      res = (res << 1) | (code & 1);
      code >>= 1;
   }
   return res;
}